

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O3

void __thiscall
LLVMBC::StreamState::append<LLVMBC::BasicBlock*,char_const(&)[3],LLVMBC::BasicBlock*>
          (StreamState *this,BasicBlock **t,char (*ts) [3],BasicBlock **ts_1)

{
  size_t sVar1;
  uint64_t local_30;
  
  local_30 = Value::get_tween_id(&(*t)->super_Value);
  append<char_const(&)[8],unsigned_long>(this,(char (*) [8])"label %",&local_30);
  sVar1 = strlen(*ts);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,*ts,sVar1);
  local_30 = Value::get_tween_id(&(*ts_1)->super_Value);
  append<char_const(&)[8],unsigned_long>(this,(char (*) [8])"label %",&local_30);
  return;
}

Assistant:

void append(T &&t, Ts &&... ts)
	{
		append(std::forward<T>(t));
		append(std::forward<Ts>(ts)...);
	}